

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::DecommitSpan(PageHeap *this,Span *span)

{
  bool bVar1;
  bool rv;
  Span *span_local;
  PageHeap *this_local;
  
  (this->stats_).decommit_count = (this->stats_).decommit_count + 1;
  bVar1 = TCMalloc_SystemRelease((void *)(span->start << 0xd),span->length << 0xd);
  if (bVar1) {
    (this->stats_).committed_bytes = (this->stats_).committed_bytes + span->length * -0x2000;
    (this->stats_).total_decommit_bytes =
         span->length * 0x2000 + (this->stats_).total_decommit_bytes;
  }
  return bVar1;
}

Assistant:

bool PageHeap::DecommitSpan(Span* span) {
  ++stats_.decommit_count;

  bool rv = TCMalloc_SystemRelease(reinterpret_cast<void*>(span->start << kPageShift),
                                   static_cast<size_t>(span->length << kPageShift));
  if (rv) {
    stats_.committed_bytes -= span->length << kPageShift;
    stats_.total_decommit_bytes += (span->length << kPageShift);
  }

  return rv;
}